

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

void __thiscall cs::compiler_type::add_constant(compiler_type *this,var *val)

{
  bool bVar1;
  reference this_00;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  value_type *in_RDI;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *unaff_retaddr;
  any *in_stack_00000030;
  
  bVar1 = cs_impl::any::is_protect((any *)in_RSI);
  if (!bVar1) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back(unaff_retaddr,in_RDI);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::back(in_RSI);
    cs_impl::any::protect(in_stack_00000030);
    this_00 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::back(in_RSI);
    cs_impl::any::mark_as_rvalue(this_00,false);
  }
  return;
}

Assistant:

void add_constant(const var &val)
		{
			if (!val.is_protect()) {
				constant_pool.push_back(val);
				constant_pool.back().protect();
				constant_pool.back().mark_as_rvalue(false);
			}
		}